

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O2

void testing_start_timer(testing t)

{
  int iVar1;
  nsync_time nVar2;
  nsync_time nVar3;
  
  iVar1 = nsync::nsync_time_cmp(t->stop_time,(nsync_time)ZEXT816(0));
  if (iVar1 != 0) {
    nVar3 = t->start_time;
    nVar2 = nsync::nsync_time_now();
    nVar2 = nsync::nsync_time_sub(nVar2,t->stop_time);
    nVar3 = nsync::nsync_time_add(nVar3,nVar2);
    t->start_time = nVar3;
    (t->stop_time).tv_sec = 0;
    (t->stop_time).tv_nsec = 0;
    return;
  }
  abort();
}

Assistant:

void testing_start_timer (testing t) {
	if (nsync_time_cmp (t->stop_time, nsync_time_zero) == 0) {
		abort ();
	}
	t->start_time = nsync_time_add (t->start_time,
		nsync_time_sub (nsync_time_now (), t->stop_time));
	t->stop_time = nsync_time_zero;
}